

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O2

void P_Attach3dMidtexLinesToSector(sector_t *sector,int lineid,int tag,bool ceiling)

{
  byte *pbVar1;
  extsector_t *peVar2;
  line_t *plVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  TArray<sector_t_*,_sector_t_*> *this;
  void *__s;
  void *__s_00;
  long lVar9;
  long lVar10;
  ulong uVar11;
  sector_t *psVar12;
  TArray<line_t_*,_line_t_*> *this_00;
  ulong __n;
  FSectorTagIterator it;
  
  if (tag != 0 || lineid != 0) {
    peVar2 = sector->e;
    this = &(&(peVar2->Midtex).Floor)[ceiling].AttachedSectors;
    uVar11 = (ulong)((numlines + 7) / 8);
    __s = operator_new__(uVar11);
    __n = (ulong)((numsectors + 7) / 8);
    __s_00 = operator_new__(__n);
    memset(__s,0,uVar11);
    memset(__s_00,0,__n);
    plVar3 = lines;
    this_00 = &(&(peVar2->Midtex).Floor)[ceiling].AttachedLines;
    uVar6 = (&(peVar2->Midtex).Floor)[ceiling].AttachedLines.Count;
    for (uVar11 = 0; psVar12 = sectors, uVar11 < uVar6; uVar11 = uVar11 + 1) {
      lVar9 = ((long)this_00->Array[uVar11] - (long)plVar3) / 0x98;
      pbVar1 = (byte *)((long)__s + (long)((int)lVar9 >> 3));
      *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar9 & 7));
    }
    uVar6 = (&(peVar2->Midtex).Floor)[ceiling].AttachedSectors.Count;
    for (uVar11 = 0; uVar11 < uVar6; uVar11 = uVar11 + 1) {
      lVar9 = ((long)this->Array[uVar11] - (long)psVar12) / 0x268;
      pbVar1 = (byte *)((long)__s_00 + (long)((int)lVar9 >> 3));
      *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar9 & 7));
    }
    TArray<line_t_*,_line_t_*>::Clear(this_00);
    TArray<sector_t_*,_sector_t_*>::Clear(this);
    if (tag == 0) {
      it.start = tagManager.IDHashFirst[lineid & 0xff];
      it.searchtag = lineid;
      while (uVar6 = FLineIdIterator::Next((FLineIdIterator *)&it), -1 < (int)uVar6) {
        if (((lines[uVar6].frontsector != (sector_t *)0x0) &&
            (lines[uVar6].backsector != (sector_t *)0x0)) && ((lines[uVar6].flags & 0x200000) != 0))
        {
          pbVar1 = (byte *)((long)__s + (ulong)(uVar6 >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar6 & 7));
        }
      }
    }
    else {
      it.start = tagManager.TagHashFirst[tag & 0xff];
      it.searchtag = tag;
      while (uVar6 = FSectorTagIterator::Next(&it), -1 < (int)uVar6) {
        psVar12 = sectors;
        for (lVar9 = 0; lVar9 < psVar12[uVar6].linecount; lVar9 = lVar9 + 1) {
          plVar3 = psVar12[uVar6].lines[lVar9];
          if (((lineid == 0) ||
              (bVar5 = FTagManager::LineHasID(&tagManager,plVar3,lineid), psVar12 = sectors, bVar5))
             && ((plVar3->frontsector != (sector_t *)0x0 &&
                 ((plVar3->backsector != (sector_t *)0x0 && ((plVar3->flags & 0x200000) != 0)))))) {
            lVar10 = ((long)plVar3 - (long)lines) / 0x98;
            pbVar1 = (byte *)((long)__s + (long)((int)lVar10 >> 3));
            *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar10 & 7));
          }
        }
      }
    }
    lVar9 = 0;
    iVar7 = numlines;
    for (uVar11 = 0; (long)uVar11 < (long)iVar7; uVar11 = uVar11 + 1) {
      if ((*(byte *)((long)__s + (uVar11 >> 3 & 0x1fffffff)) >> ((uint)uVar11 & 7) & 1) != 0) {
        it = (FSectorTagIterator)((long)lines->args + lVar9 + -0x2c);
        TArray<line_t_*,_line_t_*>::Push(this_00,(line_t **)&it);
        plVar3 = lines;
        psVar12 = sectors;
        iVar4 = numsectors;
        lVar10 = (*(long *)((long)lines->bbox + lVar9 + 0x20) - (long)sectors) / 0x268;
        iVar7 = (int)lVar10;
        if (numsectors <= iVar7) {
          __assert_fail("v < numsectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_3dmidtex.cpp"
                        ,0xc3,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
        }
        pbVar1 = (byte *)((long)__s_00 + (long)(iVar7 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar10 & 7));
        iVar7 = numlines;
        lVar10 = (*(long *)((long)plVar3->bbox + lVar9 + 0x28) - (long)psVar12) / 0x268;
        iVar8 = (int)lVar10;
        if (iVar4 <= iVar8) {
          __assert_fail("v < numsectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_3dmidtex.cpp"
                        ,199,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
        }
        pbVar1 = (byte *)((long)__s_00 + (long)(iVar8 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar10 & 7));
      }
      lVar9 = lVar9 + 0x98;
    }
    lVar9 = 0;
    iVar7 = numsectors;
    for (uVar11 = 0; (long)uVar11 < (long)iVar7; uVar11 = uVar11 + 1) {
      if ((*(byte *)((long)__s_00 + (uVar11 >> 3 & 0x1fffffff)) >> ((uint)uVar11 & 7) & 1) != 0) {
        it = (FSectorTagIterator)((long)&sectors->planes[0].xform.xOffs + lVar9);
        TArray<sector_t_*,_sector_t_*>::Push(this,(sector_t **)&it);
        iVar7 = numsectors;
      }
      lVar9 = lVar9 + 0x268;
    }
    operator_delete__(__s);
    operator_delete__(__s_00);
  }
  return;
}

Assistant:

void P_Attach3dMidtexLinesToSector(sector_t *sector, int lineid, int tag, bool ceiling)
{
	int v;

	if (lineid == 0 && tag == 0)
	{
		// invalid set of parameters
		return;
	}

	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	// Bit arrays that mark whether a line or sector is to be attached.
	BYTE *found_lines = new BYTE[(numlines+7)/8];
	BYTE *found_sectors = new BYTE[(numsectors+7)/8];

	memset(found_lines, 0, sizeof (BYTE) * ((numlines+7)/8));
	memset(found_sectors, 0, sizeof (BYTE) * ((numsectors+7)/8));

	// mark all lines and sectors that are already attached to this one
	// and clear the arrays. The old data will be re-added automatically
	// from the marker arrays.
	for (unsigned i=0; i < scrollplane.AttachedLines.Size(); i++)
	{
		int line = int(scrollplane.AttachedLines[i] - lines);
		found_lines[line>>3] |= 1 << (line&7);
	}

	for (unsigned i=0; i < scrollplane.AttachedSectors.Size(); i++)
	{
		int sec = int(scrollplane.AttachedSectors[i] - sectors);
		found_sectors[sec>>3] |= 1 << (sec&7);
	}

	scrollplane.AttachedLines.Clear();
	scrollplane.AttachedSectors.Clear();

	if (tag == 0)
	{
		FLineIdIterator itr(lineid);
		int line;
		while ((line = itr.Next()) >= 0)
		{
			line_t *ln = &lines[line];

			if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
			{
				// Only consider two-sided lines with the 3DMIDTEX flag
				continue;
			}
			found_lines[line>>3] |= 1 << (line&7);
		}
	}
	else
	{
		FSectorTagIterator it(tag);
		int sec;
		while ((sec = it.Next()) >= 0)
		{
			for (int line = 0; line < sectors[sec].linecount; line ++)
			{
				line_t *ln = sectors[sec].lines[line];

				if (lineid != 0 && !tagManager.LineHasID(ln, lineid)) continue;

				if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
				{
					// Only consider two-sided lines with the 3DMIDTEX flag
					continue;
				}
				int lineno = int(ln-lines);
				found_lines[lineno>>3] |= 1 << (lineno&7);
			}
		}
	}


	for(int i=0; i < numlines; i++)
	{
		if (found_lines[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedLines.Push(&lines[i]);

			v = int(lines[i].frontsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);

			v = int(lines[i].backsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);
		}
	}

	for (int i=0; i < numsectors; i++)
	{
		if (found_sectors[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedSectors.Push(&sectors[i]);
		}
	}

	delete[] found_lines;
	delete[] found_sectors;
}